

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O3

void secp256k1_scalar_negate(secp256k1_scalar *r,secp256k1_scalar *a)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong uVar7;
  undefined4 unaff_EBP;
  uint uVar8;
  undefined1 auVar9 [16];
  
  secp256k1_scalar_verify(a);
  auVar9._0_4_ = -(uint)((int)a->d[2] == 0 && (int)a->d[0] == 0);
  auVar9._4_4_ = -(uint)(*(int *)((long)a->d + 0x14) == 0 && *(int *)((long)a->d + 4) == 0);
  auVar9._8_4_ = -(uint)((int)a->d[3] == 0 && (int)a->d[1] == 0);
  auVar9._12_4_ = -(uint)(*(int *)((long)a->d + 0x1c) == 0 && *(int *)((long)a->d + 0xc) == 0);
  uVar8 = movmskps(unaff_EBP,auVar9);
  uVar8 = uVar8 ^ 0xf;
  secp256k1_scalar_verify(a);
  uVar1 = a->d[0];
  uVar3 = 0;
  uVar6 = ~uVar1 + 0xbfd25e8cd0364142;
  if (uVar8 == 0) {
    uVar6 = uVar3;
  }
  r->d[0] = uVar6;
  uVar1 = (ulong)(0x402da1732fc9bebd < ~uVar1);
  uVar4 = ~a->d[1] + uVar1;
  uVar6 = uVar4 + 0xbaaedce6af48a03b;
  if (uVar8 == 0) {
    uVar6 = uVar3;
  }
  uVar5 = (ulong)CARRY8(~a->d[1],uVar1);
  r->d[1] = uVar6;
  uVar1 = a->d[2];
  uVar4 = (ulong)(0x4551231950b75fc4 < uVar4);
  uVar2 = ~uVar1 + uVar5;
  uVar7 = uVar2 + uVar4;
  uVar6 = uVar7 - 2;
  if (uVar8 == 0) {
    uVar6 = uVar3;
  }
  r->d[2] = uVar6;
  uVar6 = (((ulong)(CARRY8(~uVar1,uVar5) || CARRY8(uVar2,uVar4)) + (ulong)(1 < uVar7)) - a->d[3]) -
          2;
  if (uVar8 == 0) {
    uVar6 = uVar3;
  }
  r->d[3] = uVar6;
  secp256k1_scalar_verify(r);
  return;
}

Assistant:

static void secp256k1_scalar_negate(secp256k1_scalar *r, const secp256k1_scalar *a) {
    uint64_t nonzero = 0xFFFFFFFFFFFFFFFFULL * (secp256k1_scalar_is_zero(a) == 0);
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(a);

    secp256k1_u128_from_u64(&t, ~a->d[0]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_0 + 1);
    r->d[0] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[1]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_1);
    r->d[1] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[2]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_2);
    r->d[2] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, ~a->d[3]);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_3);
    r->d[3] = secp256k1_u128_to_u64(&t) & nonzero;

    SECP256K1_SCALAR_VERIFY(r);
}